

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::PopCall(Thread *this)

{
  uint uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  value_type *frame;
  Thread *this_local;
  
  pvVar3 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                     (&this->frames_);
  uVar1 = pvVar3->exceptions;
  sVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                    (&this->exceptions_);
  if (uVar1 == sVar4) {
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::pop_back(&this->frames_)
    ;
    bVar2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::empty
                      (&this->frames_);
    if (bVar2) {
      this_local._4_4_ = Return;
    }
    else {
      pvVar3 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                         (&this->frames_);
      if (pvVar3->inst == (Instance *)0x0) {
        this_local._4_4_ = Return;
      }
      else {
        this->inst_ = pvVar3->inst;
        this->mod_ = pvVar3->mod;
        this_local._4_4_ = Ok;
      }
    }
    return this_local._4_4_;
  }
  __assert_fail("frames_.back().exceptions == exceptions_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x42b,"RunResult wabt::interp::Thread::PopCall()");
}

Assistant:

RunResult Thread::PopCall() {
  // Sanity check that the exception stack was popped correctly.
  assert(frames_.back().exceptions == exceptions_.size());

  frames_.pop_back();
  if (frames_.empty()) {
    return RunResult::Return;
  }

  auto& frame = frames_.back();
  if (!frame.inst) {
    // Returning to a HostFunc called on this thread.
    return RunResult::Return;
  }

  inst_ = frame.inst;
  mod_ = frame.mod;
  return RunResult::Ok;
}